

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
 __thiscall
mp::BasicExprFactory<std::allocator<char>>::
MakeUnary<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
          (BasicExprFactory<std::allocator<char>_> *this,Kind kind,
          BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> arg)

{
  Impl *impl_00;
  BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
  BVar1;
  Impl *in_RDX;
  Impl *impl;
  undefined8 in_stack_fffffffffffffff8;
  
  impl_00 = Allocate<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
                      ((BasicExprFactory<std::allocator<char>_> *)impl,
                       (Kind)((ulong)in_stack_fffffffffffffff8 >> 0x20),
                       (int)in_stack_fffffffffffffff8);
  impl_00->arg = in_RDX;
  BVar1 = internal::ExprBase::
          Create<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
                    (&impl_00->super_Impl);
  return (BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>)
         BVar1.super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.super_ExprBase.impl_;
}

Assistant:

ExprType MakeUnary(expr::Kind kind, Arg arg) {
    MP_ASSERT(arg != 0, "invalid argument");
    typename ExprType::Impl *impl = Allocate<ExprType>(kind);
    impl->arg = arg.impl_;
    return Expr::Create<ExprType>(impl);
  }